

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

void write_value(ValueArray *value_array,CrispyValue value)

{
  ulong uVar1;
  CrispyValue *pCVar2;
  ulong uVar3;
  uint64_t uVar4;
  
  uVar1 = value_array->cap;
  uVar3 = value_array->count;
  if (uVar3 < uVar1) {
    pCVar2 = value_array->values;
  }
  else {
    uVar4 = 8;
    if (7 < uVar1) {
      uVar4 = uVar1 * 2;
    }
    value_array->cap = uVar4;
    pCVar2 = (CrispyValue *)reallocate(value_array->values,uVar4 << 4);
    value_array->values = pCVar2;
    uVar3 = value_array->count;
  }
  value_array->count = uVar3 + 1;
  pCVar2[uVar3].type = value.type;
  pCVar2[uVar3].field_1.p_value = (uint64_t)value.field_1;
  return;
}

Assistant:

void write_value(ValueArray *value_array, CrispyValue value) {
    if (value_array->count >= value_array->cap) {
        value_array->cap = GROW_CAP(value_array->cap);
        value_array->values = GROW_ARR(value_array->values, CrispyValue, value_array->cap);
    }

    value_array->values[value_array->count++] = value;
}